

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.cpp
# Opt level: O0

void ValidateRange(Range *range,int max_cyls,int max_heads,int cyl_step,int def_cyls,int def_heads)

{
  int iVar1;
  exception *peVar2;
  int local_44;
  int local_40 [5];
  int local_2c;
  int local_28;
  int local_24;
  int local_20;
  int def_heads_local;
  int def_cyls_local;
  int cyl_step_local;
  int max_heads_local;
  int max_cyls_local;
  Range *range_local;
  
  local_20 = def_cyls;
  if (def_cyls < 1) {
    local_20 = max_cyls;
  }
  local_24 = def_heads;
  if (def_heads < 1) {
    local_24 = max_heads;
  }
  cyl_step_local = max_cyls;
  if (1 < cyl_step) {
    local_20 = (local_20 + cyl_step + -1) / cyl_step;
    cyl_step_local = (max_cyls + cyl_step + -1) / cyl_step;
  }
  def_heads_local = cyl_step;
  def_cyls_local = max_heads;
  _max_heads_local = range;
  iVar1 = Range::cyls(range);
  if (iVar1 < 1) {
    _max_heads_local->cyl_begin = 0;
    _max_heads_local->cyl_end = local_20;
  }
  if (cyl_step_local < _max_heads_local->cyl_end) {
    peVar2 = (exception *)__cxa_allocate_exception(0x10);
    local_28 = _max_heads_local->cyl_end + -1;
    local_2c = cyl_step_local + -1;
    util::exception::exception<char_const(&)[15],int,char_const(&)[19],int,char_const(&)[2]>
              (peVar2,(char (*) [15])"end cylinder (",&local_28,(char (*) [19])") out of range (0-",
               &local_2c,(char (*) [2])0x2a8e34);
    __cxa_throw(peVar2,&util::exception::typeinfo,util::exception::~exception);
  }
  iVar1 = Range::heads(_max_heads_local);
  if (iVar1 < 1) {
    _max_heads_local->head_begin = 0;
    _max_heads_local->head_end = local_24;
  }
  if (def_cyls_local < _max_heads_local->head_end) {
    peVar2 = (exception *)__cxa_allocate_exception(0x10);
    local_40[0] = _max_heads_local->head_end + -1;
    local_44 = def_cyls_local + -1;
    util::exception::exception<char_const(&)[11],int,char_const(&)[19],int,char_const(&)[2]>
              (peVar2,(char (*) [11])"end head (",local_40,(char (*) [19])") out of range (0-",
               &local_44,(char (*) [2])0x2a8e34);
    __cxa_throw(peVar2,&util::exception::typeinfo,util::exception::~exception);
  }
  return;
}

Assistant:

void ValidateRange(Range& range, int max_cyls, int max_heads, int cyl_step/*=1*/, int def_cyls/*=0*/, int def_heads/*=0*/)
{
    // Default to the normal cyl/head limits
    if (def_cyls <= 0) def_cyls = max_cyls;
    if (def_heads <= 0) def_heads = max_heads;

    // Limit default according to step, rounding up
    if (cyl_step > 1)
    {
        def_cyls = (def_cyls + (cyl_step - 1)) / cyl_step;
        max_cyls = (max_cyls + (cyl_step - 1)) / cyl_step;
    }

    // Use default if unset
    if (range.cyls() <= 0)
    {
        range.cyl_begin = 0;
        range.cyl_end = def_cyls;
    }

    if (range.cyl_end > max_cyls)
        throw util::exception("end cylinder (", range.cyl_end - 1, ") out of range (0-", max_cyls - 1, ")");

    // If no head value is given, use the default range
    if (range.heads() <= 0)
    {
        range.head_begin = 0;
        range.head_end = def_heads;
    }

    if (range.head_end > max_heads)
        throw util::exception("end head (", range.head_end - 1, ") out of range (0-", max_heads - 1, ")");
}